

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_group_t bsc_group_create_partition(uint color)

{
  bsp_size_t bVar1;
  uint uVar2;
  bsp_pid_t bVar3;
  undefined4 extraout_var;
  void *addr;
  group_t *g;
  int iVar4;
  ulong uVar5;
  bsp_size_t bVar6;
  int in_EDI;
  uint pid;
  bool bVar7;
  int local_3c;
  ulong local_38;
  
  local_3c = in_EDI;
  uVar2 = bsp_nprocs();
  bVar3 = bsp_pid();
  local_38 = CONCAT44(extraout_var,bVar3);
  addr = calloc((long)(int)uVar2,4);
  g = (group_t *)calloc(1,0x20);
  if (addr == (void *)0x0 || g == (group_t *)0x0) {
    bsp_abort("bsc_group_create_partition: Insufficient memory");
  }
  bsp_push_reg(addr,uVar2 * 4);
  bsp_sync();
  if (0 < (int)uVar2) {
    iVar4 = (int)local_38;
    pid = 0;
    do {
      bsp_put(pid,&local_3c,addr,iVar4 * 4,4);
      pid = pid + 1;
    } while (uVar2 != pid);
  }
  bsp_sync();
  if ((int)uVar2 < 1) {
    bVar3 = 0;
    bVar6 = 0;
  }
  else {
    uVar5 = 0;
    bVar6 = 0;
    bVar3 = 0;
    do {
      bVar1 = bVar6;
      if ((local_38 & 0xffffffff) == uVar5) {
        bVar1 = bVar3;
      }
      bVar7 = *(int *)((long)addr + uVar5 * 4) == local_3c;
      if (bVar7) {
        bVar6 = bVar1;
      }
      bVar3 = bVar3 + (uint)bVar7;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  group_create(g,bVar3);
  if (0 < (int)uVar2) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (*(int *)((long)addr + uVar5 * 4) == local_3c) {
        g->lid[uVar5] = iVar4;
        g->rof[iVar4] = bVar6;
        g->gid[iVar4] = (bsp_pid_t)uVar5;
        iVar4 = iVar4 + 1;
      }
      else {
        g->lid[uVar5] = -1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  return g;
}

Assistant:

bsc_group_t bsc_group_create_partition( unsigned color )
{
    bsp_pid_t i, j, P = bsp_nprocs(), s = bsp_pid();
    bsp_pid_t n_members = 0;
    bsp_pid_t rof = 0;
    unsigned * all_colors = calloc( P, sizeof(all_colors[0]) );
    group_t * g = calloc( 1, sizeof(*g) );
    if (!all_colors || !g)
        bsp_abort("bsc_group_create_partition: Insufficient memory");
    bsp_push_reg( all_colors, P * sizeof(all_colors[0]) );
    bsp_sync();

    /* all-gather the colors */
    for ( i = 0 ; i < P; ++i ) {
        bsp_put( i, &color, all_colors, sizeof(all_colors[0])*s,
                sizeof(all_colors[0]) );
    }
    bsp_sync();

    /* count number of members */
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            if (i == s ) rof = n_members;
            n_members += 1;
        }

    group_create( g, n_members );
    j = 0;
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            g->lid[ i ] = j;
            g->rof[ j ] = rof;
            g->gid[ j ] = i;
            j++;
        }
        else {
            g->lid[i] = -1;
        }

    bsp_pop_reg(all_colors);
    bsp_sync();
    free(all_colors);

    return g;
}